

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O2

void __thiscall chrono::ChLinkDistance::ArchiveIN(ChLinkDistance *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkDistance>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_30._value = &this->distance;
  local_30._name = "distance";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->pos1;
  local_48._name = "pos1";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->pos2;
  local_60._name = "pos2";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChLinkDistance::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkDistance>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(distance);
    marchive >> CHNVP(pos1);
    marchive >> CHNVP(pos2);
}